

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O2

int SignedLong_Signed_Test::AddToRegistry(void)

{
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<SignedLong> *this_01;
  TestMetaFactoryBase<long> *meta_factory;
  allocator local_a2;
  allocator local_a1;
  string local_a0 [32];
  CodeLocation local_80;
  CodeLocation local_58;
  string local_30 [32];
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  std::__cxx11::string::string
            (local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
             ,&local_a1);
  std::__cxx11::string::string((string *)&local_58,local_30);
  local_58.line = 0x13e;
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::GetTestSuitePatternHolder<SignedLong>
                      (this_00,"SignedLong",&local_58);
  meta_factory = (TestMetaFactoryBase<long> *)operator_new(8);
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)&PTR__TestMetaFactoryBase_0022a0d8;
  std::__cxx11::string::string
            (local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
             ,&local_a2);
  std::__cxx11::string::string((string *)&local_80,local_a0);
  local_80.line = 0x13e;
  testing::internal::ParameterizedTestSuiteInfo<SignedLong>::AddTestPattern
            (this_01,"SignedLong","Signed",meta_factory,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

TEST_P (SignedLong, Signed) {
    SCOPED_TRACE ("SignedLong");
    check (GetParam ());
}